

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_abc_k(jit_State *J)

{
  ushort uVar1;
  uint uVar2;
  IRIns *pIVar3;
  uint32_t k;
  IRIns *ir;
  IRRef asize;
  IRRef ref;
  jit_State *J_local;
  
  if (((J->fold).left[0].field_1.t.irt & 0x40) == 0) {
    if ((J->flags & 0x800000) == 0) {
      J_local._4_4_ = 0;
    }
    else {
      uVar2 = (uint)(J->fold).ins.field_0.op1;
      uVar1 = J->chain[10];
      while (ir._4_4_ = (uint)uVar1, uVar2 < ir._4_4_) {
        pIVar3 = (J->cur).ir + ir._4_4_;
        if (((pIVar3->field_0).op1 == uVar2) && ((pIVar3->field_0).op2 < 0x8000)) {
          if ((J->cur).ir[(pIVar3->field_0).op2].field_1.op12 < (J->fold).right[0].field_1.op12) {
            (pIVar3->field_0).op2 = (J->fold).ins.field_0.op2;
          }
          return 4;
        }
        uVar1 = (pIVar3->field_0).prev;
      }
      J_local._4_4_ = lj_ir_emit(J);
    }
  }
  else {
    J_local._4_4_ = 0;
  }
  return J_local._4_4_;
}

Assistant:

LJFOLD(ABC any KINT)
LJFOLDF(abc_k)
{
  PHIBARRIER(fleft);
  if (LJ_LIKELY(J->flags & JIT_F_OPT_ABC)) {
    IRRef ref = J->chain[IR_ABC];
    IRRef asize = fins->op1;
    while (ref > asize) {
      IRIns *ir = IR(ref);
      if (ir->op1 == asize && irref_isk(ir->op2)) {
	uint32_t k = (uint32_t)IR(ir->op2)->i;
	if ((uint32_t)fright->i > k)
	  ir->op2 = fins->op2;
	return DROPFOLD;
      }
      ref = ir->prev;
    }
    return EMITFOLD;  /* Already performed CSE. */
  }
  return NEXTFOLD;
}